

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

XSAnnotation * __thiscall
xercesc_4_0::XSObjectFactory::getAnnotationFromModel
          (XSObjectFactory *this,XSModel *xsModel,void *key)

{
  BaseRefVectorOf<xercesc_4_0::XSNamespaceItem> *this_00;
  XMLSize_t XVar1;
  XSNamespaceItem *pXVar2;
  XSAnnotation *pXVar3;
  XSNamespaceItem *nsItem;
  uint i;
  XSAnnotation *annot;
  XSNamespaceItemList *namespaceItemList;
  void *key_local;
  XSModel *xsModel_local;
  XSObjectFactory *this_local;
  
  this_00 = &XSModel::getNamespaceItems(xsModel)->
             super_BaseRefVectorOf<xercesc_4_0::XSNamespaceItem>;
  nsItem._4_4_ = 0;
  while( true ) {
    XVar1 = BaseRefVectorOf<xercesc_4_0::XSNamespaceItem>::size(this_00);
    if (XVar1 <= nsItem._4_4_) {
      if (xsModel->fParent == (XSModel *)0x0) {
        this_local = (XSObjectFactory *)0x0;
      }
      else {
        this_local = (XSObjectFactory *)getAnnotationFromModel(this,xsModel->fParent,key);
      }
      return (XSAnnotation *)this_local;
    }
    pXVar2 = BaseRefVectorOf<xercesc_4_0::XSNamespaceItem>::elementAt(this_00,(ulong)nsItem._4_4_);
    if ((pXVar2->fGrammar != (SchemaGrammar *)0x0) &&
       (pXVar3 = SchemaGrammar::getAnnotation(pXVar2->fGrammar,key), pXVar3 != (XSAnnotation *)0x0))
    break;
    nsItem._4_4_ = nsItem._4_4_ + 1;
  }
  return pXVar3;
}

Assistant:

XSAnnotation* XSObjectFactory::getAnnotationFromModel(XSModel* const xsModel,
                                               const void* const key)
{
    XSNamespaceItemList* namespaceItemList = xsModel->getNamespaceItems();

    XSAnnotation* annot = 0;
    for (unsigned int i=0; i<namespaceItemList->size(); i++)
    {
        XSNamespaceItem* nsItem = namespaceItemList->elementAt(i);
        if (nsItem->fGrammar)
        {
            annot = nsItem->fGrammar->getAnnotation(key);
            if (annot)
                return annot;
        }
    }

    if (xsModel->fParent)
        return getAnnotationFromModel(xsModel->fParent, key);
    return 0;
}